

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::MapCacheIdsToPropertyIds(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint rootObjectLoadInlineCacheStart;
  uint uVar1;
  PropertyId propertyId;
  Type pSVar2;
  Type pSVar3;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  undefined8 uVar5;
  code *pcVar6;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  bool bVar8;
  FunctionBody *this_00;
  undefined4 *puVar9;
  Type *pTVar10;
  Type *pTVar11;
  NodeBase *pNVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint rootObjectStoreInlineCacheStart;
  int iVar17;
  uint rootObjectLoadMethodInlineCacheStart;
  uint uVar18;
  undefined1 local_78 [8];
  Iterator toStringIter;
  undefined1 local_48 [8];
  Iterator valueOfIter;
  
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  rootObjectLoadInlineCacheStart = funcInfo->inlineCacheCount;
  rootObjectLoadMethodInlineCacheStart =
       funcInfo->rootObjectLoadInlineCacheCount + rootObjectLoadInlineCacheStart;
  rootObjectStoreInlineCacheStart =
       funcInfo->rootObjectLoadMethodInlineCacheCount + rootObjectLoadMethodInlineCacheStart;
  uVar1 = funcInfo->rootObjectStoreInlineCacheCount;
  Js::FunctionBody::CreateCacheIdToPropertyIdMap
            (this_00,rootObjectLoadInlineCacheStart,rootObjectLoadMethodInlineCacheStart,
             rootObjectStoreInlineCacheStart,rootObjectStoreInlineCacheStart + uVar1,
             funcInfo->isInstInlineCacheCount);
  if (uVar1 + rootObjectStoreInlineCacheStart == 0) {
    return;
  }
  valueOfIter.current = (NodeBase *)funcInfo;
  if (funcInfo->inlineCacheMap->bucketCount != 0) {
    toStringIter.current = (NodeBase *)funcInfo->inlineCacheMap;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar15 = 0;
    pNVar12 = toStringIter.current;
    do {
      iVar17 = *(int *)((long)&pNVar12->next->next + uVar15 * 4);
      while (iVar17 != -1) {
        lVar13 = (long)iVar17;
        iVar17 = *(int *)&pNVar12[1].next[lVar13 * 2 + 1].next;
        pSVar2 = pNVar12[1].next[lVar13 * 2].next;
        pNVar12 = toStringIter.current;
        if (*(int *)((long)&pSVar2[3].next + 4) != 0) {
          uVar14 = 0;
          do {
            iVar16 = *(int *)((long)&pSVar2->next->next + uVar14 * 4);
            pSVar7 = valueOfIter.list;
            while (valueOfIter.list = pSVar7, iVar16 != -1) {
              pSVar3 = pSVar2[1].next;
              lVar13 = (long)iVar16;
              iVar16 = *(int *)&pSVar3[lVar13 * 2 + 1].next;
              pSVar4 = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
                       pSVar3[lVar13 * 2].next;
              pSVar7 = valueOfIter.list;
              if (pSVar4 != (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                propertyId = *(PropertyId *)((long)&pSVar3[lVar13 * 2 + 1].next + 4);
                local_48 = (undefined1  [8])pSVar4;
                valueOfIter.list = pSVar4;
                while( true ) {
                  if (valueOfIter.list ==
                      (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar9 = 1;
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                       ,0x76,"(current != nullptr)","current != nullptr");
                    if (!bVar8) goto LAB_008152b3;
                    *puVar9 = 0;
                  }
                  valueOfIter.list =
                       (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
                       ((valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                  pSVar7 = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
                  if ((undefined1  [8])valueOfIter.list == local_48) break;
                  pTVar10 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Iterator
                            ::Data((Iterator *)local_48);
                  uVar5 = *(undefined8 *)&pTVar10->field_0;
                  uVar1 = (pTVar10->field_0).field_0.storeCacheId;
                  uVar18 = (uint)uVar5;
                  if (uVar18 != 0xffffffff) {
                    Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar18,propertyId);
                  }
                  uVar18 = (uint)((ulong)uVar5 >> 0x20);
                  if (uVar18 != 0xffffffff) {
                    Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar18,propertyId);
                  }
                  if (uVar1 != 0xffffffff) {
                    Js::FunctionBody::SetPropertyIdForCacheId(this_00,uVar1,propertyId);
                  }
                }
              }
            }
            uVar14 = uVar14 + 1;
            pNVar12 = toStringIter.current;
          } while (uVar14 < *(uint *)((long)&pSVar2[3].next + 4));
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < *(uint *)((long)&pNVar12[3].next + 4));
  }
  pSVar2 = valueOfIter.current[0x43].next;
  if (*(int *)((long)&pSVar2[3].next + 4) != 0) {
    uVar15 = 0;
    do {
      iVar17 = *(int *)((long)&pSVar2->next->next + uVar15 * 4);
      while (iVar17 != -1) {
        pSVar3 = pSVar2[1].next;
        lVar13 = (long)iVar17;
        iVar17 = *(int *)((long)pSVar3 + lVar13 * 0xc + 4);
        Js::FunctionBody::SetPropertyIdForCacheId
                  (this_00,*(int *)((long)pSVar3 + lVar13 * 0xc) + rootObjectLoadInlineCacheStart,
                   *(PropertyId *)((long)pSVar3 + lVar13 * 0xc + 8));
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < *(uint *)((long)&pSVar2[3].next + 4));
  }
  pSVar2 = valueOfIter.current[0x44].next;
  if (*(int *)((long)&pSVar2[3].next + 4) != 0) {
    uVar15 = 0;
    do {
      iVar17 = *(int *)((long)&pSVar2->next->next + uVar15 * 4);
      while (iVar17 != -1) {
        pSVar3 = pSVar2[1].next;
        lVar13 = (long)iVar17;
        iVar17 = *(int *)((long)pSVar3 + lVar13 * 0xc + 4);
        Js::FunctionBody::SetPropertyIdForCacheId
                  (this_00,*(int *)((long)pSVar3 + lVar13 * 0xc) +
                           rootObjectLoadMethodInlineCacheStart,
                   *(PropertyId *)((long)pSVar3 + lVar13 * 0xc + 8));
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < *(uint *)((long)&pSVar2[3].next + 4));
  }
  pSVar2 = valueOfIter.current[0x45].next;
  if (*(int *)((long)&pSVar2[3].next + 4) != 0) {
    uVar15 = 0;
    do {
      iVar17 = *(int *)((long)&pSVar2->next->next + uVar15 * 4);
      while (iVar17 != -1) {
        pSVar3 = pSVar2[1].next;
        lVar13 = (long)iVar17;
        iVar17 = *(int *)((long)pSVar3 + lVar13 * 0xc + 4);
        Js::FunctionBody::SetPropertyIdForCacheId
                  (this_00,*(int *)((long)pSVar3 + lVar13 * 0xc) + rootObjectStoreInlineCacheStart,
                   *(PropertyId *)((long)pSVar3 + lVar13 * 0xc + 8));
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < *(uint *)((long)&pSVar2[3].next + 4));
  }
  local_48 = (undefined1  [8])(valueOfIter.current + 0x49);
  valueOfIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)local_48;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (valueOfIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_008152b3;
      *puVar9 = 0;
    }
    valueOfIter.list =
         (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
         ((valueOfIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])valueOfIter.list == local_48) break;
    pTVar11 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    Js::FunctionBody::SetPropertyIdForCacheId(this_00,*pTVar11,0x18e);
  }
  local_78 = (undefined1  [8])(valueOfIter.current + 0x4b);
  toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)local_78;
  valueOfIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (toStringIter.list == (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) {
LAB_008152b3:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    toStringIter.list =
         (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)
         ((toStringIter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])toStringIter.list == local_78) {
      toStringIter.list = (SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount> *)0x0;
      Js::FunctionBody::VerifyCacheIdToPropertyIdMap(this_00);
      return;
    }
    pTVar11 = SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_78);
    Js::FunctionBody::SetPropertyIdForCacheId(this_00,*pTVar11,0x178);
  } while( true );
}

Assistant:

void ByteCodeGenerator::MapCacheIdsToPropertyIds(FuncInfo *funcInfo)
{
    Js::FunctionBody *functionBody = funcInfo->GetParsedFunctionBody();
    uint rootObjectLoadInlineCacheStart = funcInfo->GetInlineCacheCount();
    uint rootObjectLoadMethodInlineCacheStart = rootObjectLoadInlineCacheStart + funcInfo->GetRootObjectLoadInlineCacheCount();
    uint rootObjectStoreInlineCacheStart = rootObjectLoadMethodInlineCacheStart + funcInfo->GetRootObjectLoadMethodInlineCacheCount();
    uint totalFieldAccessInlineCacheCount = rootObjectStoreInlineCacheStart + funcInfo->GetRootObjectStoreInlineCacheCount();

    functionBody->CreateCacheIdToPropertyIdMap(rootObjectLoadInlineCacheStart, rootObjectLoadMethodInlineCacheStart,
        rootObjectStoreInlineCacheStart, totalFieldAccessInlineCacheCount, funcInfo->GetIsInstInlineCacheCount());

    if (totalFieldAccessInlineCacheCount == 0)
    {
        return;
    }

    funcInfo->inlineCacheMap->Map([functionBody](Js::RegSlot regSlot, FuncInfo::InlineCacheIdMap *inlineCacheIdMap)
    {
        inlineCacheIdMap->Map([functionBody](Js::PropertyId propertyId, FuncInfo::InlineCacheList* inlineCacheList)
        {
            if (inlineCacheList)
            {
                inlineCacheList->Iterate([functionBody, propertyId](InlineCacheUnit cacheUnit)
                {
                    CompileAssert(offsetof(InlineCacheUnit, cacheId) == offsetof(InlineCacheUnit, loadCacheId));
                    if (cacheUnit.loadCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadCacheId, propertyId);
                    }
                    if (cacheUnit.loadMethodCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.loadMethodCacheId, propertyId);
                    }
                    if (cacheUnit.storeCacheId != -1)
                    {
                        functionBody->SetPropertyIdForCacheId(cacheUnit.storeCacheId, propertyId);
                    }
                });
            }
        });
    });

    funcInfo->rootObjectLoadInlineCacheMap->Map([functionBody, rootObjectLoadInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectLoadMethodInlineCacheMap->Map([functionBody, rootObjectLoadMethodInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectLoadMethodInlineCacheStart, propertyId);
    });
    funcInfo->rootObjectStoreInlineCacheMap->Map([functionBody, rootObjectStoreInlineCacheStart](Js::PropertyId propertyId, uint cacheId)
    {
        functionBody->SetPropertyIdForCacheId(cacheId + rootObjectStoreInlineCacheStart, propertyId);
    });

    SListBase<uint>::Iterator valueOfIter(&funcInfo->valueOfStoreCacheIds);
    while (valueOfIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(valueOfIter.Data(), Js::PropertyIds::valueOf);
    }

    SListBase<uint>::Iterator toStringIter(&funcInfo->toStringStoreCacheIds);
    while (toStringIter.Next())
    {
        functionBody->SetPropertyIdForCacheId(toStringIter.Data(), Js::PropertyIds::toString);
    }

#if DBG
    functionBody->VerifyCacheIdToPropertyIdMap();
#endif
}